

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomes.c
# Opt level: O2

int isOceanic(int id)

{
  return (int)((1L << ((byte)id & 0x3f) & 0x7f00001000401U) != 0 && (uint)id < 0x40);
}

Assistant:

int isOceanic(int id)
{
    const uint64_t ocean_bits =
            (1ULL << ocean) |
            (1ULL << frozen_ocean) |
            (1ULL << warm_ocean) |
            (1ULL << lukewarm_ocean) |
            (1ULL << cold_ocean) |
            (1ULL << deep_ocean) |
            (1ULL << deep_warm_ocean) |
            (1ULL << deep_lukewarm_ocean) |
            (1ULL << deep_cold_ocean) |
            (1ULL << deep_frozen_ocean);
    return (uint32_t) id < 64 && ((1ULL << id) & ocean_bits);
}